

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.hpp
# Opt level: O0

ws_frame_type __thiscall
cinatra::websocket::parse_payload(websocket *this,span<char,_18446744073709551615UL> buf)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  long in_RDI;
  size_t i;
  ulong local_28;
  span<char,_18446744073709551615UL> local_18;
  ws_frame_type local_4;
  
  if (*(int *)(in_RDI + 0x20) != 0) {
    for (local_28 = 0; local_28 < *(ulong *)(in_RDI + 0x10); local_28 = local_28 + 1) {
      pbVar3 = (byte *)std::span<char,_18446744073709551615UL>::operator[](&local_18,local_28);
      bVar1 = *pbVar3;
      bVar2 = *(byte *)(in_RDI + 0x20 + (local_28 & 3));
      pbVar3 = (byte *)std::span<char,_18446744073709551615UL>::operator[](&local_18,local_28);
      *pbVar3 = bVar1 ^ bVar2;
    }
  }
  if (*(char *)(in_RDI + 0x24) == '\0') {
    local_4 = WS_INCOMPLETE_TEXT_FRAME;
    if (*(char *)(in_RDI + 0x25) != '\0') {
      local_4 = WS_TEXT_FRAME;
    }
  }
  else if (*(char *)(in_RDI + 0x24) == '\x01') {
    local_4 = WS_INCOMPLETE_TEXT_FRAME;
    if (*(char *)(in_RDI + 0x25) != '\0') {
      local_4 = WS_TEXT_FRAME;
    }
  }
  else if (*(char *)(in_RDI + 0x24) == '\x02') {
    local_4 = WS_INCOMPLETE_BINARY_FRAME;
    if (*(char *)(in_RDI + 0x25) != '\0') {
      local_4 = WS_BINARY_FRAME;
    }
  }
  else if (*(char *)(in_RDI + 0x24) == '\b') {
    local_4 = WS_CLOSE_FRAME;
  }
  else if (*(char *)(in_RDI + 0x24) == '\t') {
    local_4 = WS_PING_FRAME;
  }
  else if (*(char *)(in_RDI + 0x24) == '\n') {
    local_4 = WS_PONG_FRAME;
  }
  else {
    local_4 = WS_ERROR_FRAME;
  }
  return local_4;
}

Assistant:

ws_frame_type parse_payload(std::span<char> buf) {
    // unmask data:
    if (*(uint32_t *)mask_key_ != 0) {
      for (size_t i = 0; i < payload_length_; i++) {
        buf[i] = buf[i] ^ mask_key_[i % 4];
      }
    }

    if (msg_opcode_ == 0x0)
      return (msg_fin_)
                 ? ws_frame_type::WS_TEXT_FRAME
                 : ws_frame_type::WS_INCOMPLETE_TEXT_FRAME;  // continuation
    // frame ?
    if (msg_opcode_ == 0x1)
      return (msg_fin_) ? ws_frame_type::WS_TEXT_FRAME
                        : ws_frame_type::WS_INCOMPLETE_TEXT_FRAME;
    if (msg_opcode_ == 0x2)
      return (msg_fin_) ? ws_frame_type::WS_BINARY_FRAME
                        : ws_frame_type::WS_INCOMPLETE_BINARY_FRAME;
    if (msg_opcode_ == 0x8)
      return ws_frame_type::WS_CLOSE_FRAME;
    if (msg_opcode_ == 0x9)
      return ws_frame_type::WS_PING_FRAME;
    if (msg_opcode_ == 0xA)
      return ws_frame_type::WS_PONG_FRAME;
    return ws_frame_type::WS_ERROR_FRAME;
  }